

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# serializer.hpp
# Opt level: O2

ostream * toml::operator<<(ostream *os,basic_value<toml::type_config> *v)

{
  spec s;
  string_type local_50;
  undefined8 local_30;
  undefined8 uStack_28;
  undefined8 local_20;
  
  spec::default_version();
  s.version.patch = (undefined4)uStack_28;
  s.v1_1_0_allow_control_characters_in_comments = (bool)uStack_28._4_1_;
  s.v1_1_0_allow_newlines_in_inline_tables = (bool)uStack_28._5_1_;
  s.v1_1_0_allow_trailing_comma_in_inline_tables = (bool)uStack_28._6_1_;
  s.v1_1_0_allow_non_english_in_bare_keys = (bool)uStack_28._7_1_;
  s.version.major = (undefined4)local_30;
  s.version.minor = local_30._4_4_;
  s.v1_1_0_add_escape_sequence_e = (bool)(undefined1)local_20;
  s.v1_1_0_add_escape_sequence_x = (bool)local_20._1_1_;
  s.v1_1_0_make_seconds_optional = (bool)local_20._2_1_;
  s.ext_hex_float = (bool)local_20._3_1_;
  s.ext_num_suffix = (bool)local_20._4_1_;
  s.ext_null_value = (bool)local_20._5_1_;
  s._22_2_ = local_20._6_2_;
  format<toml::type_config>(&local_50,v,s);
  std::operator<<(os,(string *)&local_50);
  std::__cxx11::string::~string((string *)&local_50);
  return os;
}

Assistant:

std::ostream& operator<<(std::ostream& os, const basic_value<TC>& v)
{
    os << format(v);
    return os;
}